

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::VariablesQbSetSpeed(ChMatterMeshless *this,double step)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  pointer psVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  ChVector<double> local_68;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_48 [24];
  
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    uVar6 = 1;
    uVar7 = 0;
    dVar8 = 1.0 / step;
    do {
      peVar3 = psVar5[uVar7].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar4 = *(undefined1 (*) [16])(peVar3->super_ChNodeXYZ).pos_dt.m_data;
      dVar1 = (peVar3->super_ChNodeXYZ).pos_dt.m_data[2];
      ChVariables::Get_qb((ChVectorRef *)local_48,&(peVar3->variables).super_ChVariables);
      ChVector<double>::
      ChVector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (&local_68,local_48,(type *)0x0);
      if (&(peVar3->super_ChNodeXYZ).pos_dt != &local_68) {
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[0] = local_68.m_data[0];
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[1] = local_68.m_data[1];
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[2] = local_68.m_data[2];
      }
      psVar5 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((step != 0.0) || (NAN(step))) {
        peVar3 = psVar5[uVar7].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar2 = (peVar3->super_ChNodeXYZ).pos_dt.m_data[2];
        auVar4 = vsubpd_avx(*(undefined1 (*) [16])(peVar3->super_ChNodeXYZ).pos_dt.m_data,auVar4);
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[0] = auVar4._0_8_ * dVar8;
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[1] = auVar4._8_8_ * dVar8;
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[2] = (dVar2 - dVar1) * dVar8;
      }
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void ChMatterMeshless::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb());

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}